

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expreplay.h
# Opt level: O0

void ExpReplay::end_pass(expreplay *er)

{
  example *in_RDI;
  learner<char,_example> *unaff_retaddr;
  size_t n;
  uchar *i;
  
  for (i = (uchar *)0x0; i < (in_RDI->super_example_predict).indices._end; i = i + 1) {
    if ((i[(in_RDI->super_example_predict).indices.erase_count] & 1) != 0) {
      LEARNER::learner<char,_example>::learn(unaff_retaddr,in_RDI,(size_t)i);
      i[(in_RDI->super_example_predict).indices.erase_count] = '\0';
    }
  }
  return;
}

Assistant:

void end_pass(expreplay& er)
{  // we need to go through and learn on everyone who remains
  // also need to clean up remaining examples
  for (size_t n = 0; n < er.N; n++)
    if (er.filled[n])
    {  // TODO: if er.replay_count > 1 do we need to play these more?
      er.base->learn(er.buf[n]);
      er.filled[n] = false;
    }
}